

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *
jsoncons::jsonpath::
select<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
          basic_path_node<char> *path)

{
  basic_path_node<char> *this;
  value_type pbVar1;
  bool bVar2;
  json_type jVar3;
  path_node_kind pVar4;
  reference ppbVar5;
  reference ppbVar6;
  char *pcVar7;
  char *pcVar8;
  reference this_00;
  int __c;
  int __c_00;
  basic_path_node<char> *in_RSI;
  basic_path_node<char> ***__s;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_RDI;
  string_view_type sVar9;
  const_object_iterator cVar10;
  iterator iVar11;
  const_object_iterator it;
  basic_path_node<char> *node;
  iterator __end0;
  iterator __begin0;
  vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
  *__range2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *current;
  path_node_type *p;
  size_t len;
  vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
  nodes;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_fffffffffffffe90;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffffe98;
  value_type *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined1 in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff09;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_ffffffffffffff20;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_path_node<char> **local_80;
  __normal_iterator<const_jsoncons::jsonpath::basic_path_node<char>_**,_std::vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>_>
  local_78;
  vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
  *local_70;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *local_68;
  value_type local_60;
  size_type local_58;
  undefined8 local_38;
  vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
  local_30;
  value_type local_18;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *local_10;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  basic_path_node<char>::size(in_RSI);
  local_38 = 0;
  std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>::allocator
            ((allocator<const_jsoncons::jsonpath::basic_path_node<char>_*> *)0x5bfbc7);
  std::
  vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
  ::vector((vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
            *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
           in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
           (allocator_type *)in_stack_fffffffffffffe98);
  std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>::~allocator
            ((allocator<const_jsoncons::jsonpath::basic_path_node<char>_*> *)0x5bfbf5);
  local_58 = std::
             vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
             ::size(&local_30);
  for (local_60 = local_18; pbVar1 = local_60, local_60 != (value_type)0x0;
      local_60 = basic_path_node<char>::parent(local_60)) {
    local_58 = local_58 - 1;
    ppbVar5 = std::
              vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
              ::operator[](&local_30,local_58);
    *ppbVar5 = pbVar1;
  }
  local_68 = local_10;
  local_70 = &local_30;
  local_78._M_current =
       (basic_path_node<char> **)
       std::
       vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
       ::begin((vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
                *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  local_80 = (basic_path_node<char> **)
             std::
             vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
             ::end((vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
                    *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  sVar9._M_str = (char *)in_stack_fffffffffffffea0;
  sVar9._M_len = in_stack_fffffffffffffea8;
  do {
    __s = &local_80;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_jsoncons::jsonpath::basic_path_node<char>_**,_std::vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>_>
                        *)in_stack_fffffffffffffe90._M_current,
                       (__normal_iterator<const_jsoncons::jsonpath::basic_path_node<char>_**,_std::vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    if (!bVar2) {
      local_8 = local_68;
LAB_005bffcc:
      std::
      vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
      ::~vector((vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
                 *)sVar9._M_str);
      return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_8;
    }
    ppbVar6 = __gnu_cxx::
              __normal_iterator<const_jsoncons::jsonpath::basic_path_node<char>_**,_std::vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>_>
              ::operator*(&local_78);
    this = *ppbVar6;
    pVar4 = basic_path_node<char>::node_kind(this);
    if (pVar4 == index) {
      jVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe98);
      if (jVar3 == array_value) {
        pcVar7 = basic_path_node<char>::index(this,(char *)__s,__c);
        pcVar8 = (char *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                                   ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffe98);
        if (pcVar7 < pcVar8) {
          basic_path_node<char>::index(this,(char *)__s,__c_00);
          local_68 = (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                      *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                  (in_stack_ffffffffffffff28,
                                   (size_t)in_stack_ffffffffffffff20._M_current);
          goto LAB_005bff9d;
        }
      }
      local_8 = (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                 *)0x0;
      goto LAB_005bffcc;
    }
    pVar4 = basic_path_node<char>::node_kind(this);
    if (pVar4 == name) {
      jVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe98);
      if (jVar3 != object_value) {
        local_8 = (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                   *)0x0;
        goto LAB_005bffcc;
      }
      in_stack_fffffffffffffe98 = local_68;
      sVar9 = basic_path_node<char>::name(this);
      cVar10 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff10._M_current,
                          (string_view_type *)
                          CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      in_stack_fffffffffffffe90 = cVar10.it_._M_current;
      in_stack_fffffffffffffe8f = cVar10.has_value_;
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe90._M_current);
      iVar11 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
               ::end((range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                      *)&stack0xffffffffffffff10);
      in_stack_ffffffffffffff08 = iVar11.has_value_;
      bVar2 = jsoncons::detail::
              random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
              ::operator==(in_stack_fffffffffffffe98,
                           (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                            *)in_stack_fffffffffffffe90._M_current);
      if (bVar2) {
        local_8 = (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                   *)0x0;
        goto LAB_005bffcc;
      }
      this_00 = jsoncons::detail::
                random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                             *)0x5bff8b);
      local_68 = (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  *)key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::value(this_00);
    }
LAB_005bff9d:
    __gnu_cxx::
    __normal_iterator<const_jsoncons::jsonpath::basic_path_node<char>_**,_std::vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>_>
    ::operator++(&local_78);
  } while( true );
}

Assistant:

Json* select(Json& root, const basic_path_node<typename Json::char_type>& path)
    {
        using path_node_type = basic_path_node<typename Json::char_type>;

        std::vector<const path_node_type*> nodes(path.size(), nullptr);
        std::size_t len = nodes.size();
        const path_node_type* p = std::addressof(path);
        while (p != nullptr)
        {
            nodes[--len] = p;
            p = p->parent();
        }

        Json* current = std::addressof(root);
        for (auto node : nodes)
        {
            if (node->node_kind() == path_node_kind::index)
            {
                if (current->type() != json_type::array_value || node->index() >= current->size())
                {
                    return nullptr; 
                }
                current = std::addressof(current->at(node->index()));
            }
            else if (node->node_kind() == path_node_kind::name)
            {
                if (current->type() != json_type::object_value)
                {
                    return nullptr;
                }
                auto it = current->find(node->name());
                if (it == current->object_range().end())
                {
                    return nullptr;
                }
                current = std::addressof((*it).value());
            }
        }
        return current;
    }